

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

Float __thiscall pbrt::LanczosSincFilter::Integral(LanczosSincFilter *this)

{
  float fVar1;
  float fVar2;
  Tuple2<pbrt::Vector2,_float> TVar3;
  int iVar4;
  int x;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  Float FVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 in_register_00001444 [12];
  Tuple2<pbrt::Point2,_float> local_50;
  undefined1 local_48 [16];
  
  fVar1 = (this->radius).super_Tuple2<pbrt::Vector2,_float>.x;
  fVar2 = (this->radius).super_Tuple2<pbrt::Vector2,_float>.y;
  uVar6 = 0x853c49e6748fea9b;
  fVar12 = 0.0;
  iVar4 = 0;
  auVar19 = ZEXT1664(CONCAT412(0x3f7fffff,CONCAT48(0x3f7fffff,0x3f7fffff3f7fffff)));
  auVar11 = vpmovsxbq_avx(ZEXT216(0x2d1b));
  auVar18 = ZEXT1664(auVar11);
  auVar11 = vpmovsxbq_avx(ZEXT216(0x1b2d));
  auVar20 = ZEXT1664(auVar11);
  auVar21 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  do {
    local_48._0_4_ = (undefined4)iVar4;
    local_48._4_12_ = in_register_00001444;
    iVar5 = 0;
    uVar7 = uVar6;
    do {
      auVar11._0_4_ = (float)iVar5;
      auVar11._4_12_ = in_register_00001444;
      auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)local_48._0_4_),0x10);
      uVar8 = uVar7 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar6 = uVar8 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar7;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar8;
      auVar14 = vpunpcklqdq_avx(auVar13,auVar17);
      auVar9 = vpsrlvq_avx2(auVar14,auVar18._0_16_);
      auVar13 = vpsrlvq_avx2(auVar14,auVar20._0_16_);
      auVar9 = vpshufd_avx(auVar9 ^ auVar13,0xe8);
      auVar14 = vpsrlq_avx(auVar14,0x3b);
      auVar14 = vpshufd_avx(auVar14,0xe8);
      auVar9 = vprorvd_avx512vl(auVar9,auVar14);
      auVar9 = vcvtudq2ps_avx512vl(auVar9);
      auVar15._0_4_ = auVar9._0_4_ * 2.3283064e-10;
      auVar15._4_4_ = auVar9._4_4_ * 2.3283064e-10;
      auVar15._8_4_ = auVar9._8_4_ * 2.3283064e-10;
      auVar15._12_4_ = auVar9._12_4_ * 2.3283064e-10;
      auVar9 = vminps_avx(auVar15,auVar19._0_16_);
      auVar14._0_4_ = (auVar9._0_4_ + auVar11._0_4_) * 0.015625;
      auVar14._4_4_ = (auVar9._4_4_ + auVar11._4_4_) * 0.015625;
      auVar14._8_4_ = (auVar9._8_4_ + auVar11._8_4_) * 0.015625;
      auVar14._12_4_ = (auVar9._12_4_ + auVar11._12_4_) * 0.015625;
      TVar3 = (this->radius).super_Tuple2<pbrt::Vector2,_float>;
      auVar16._8_8_ = 0;
      auVar16._0_4_ = TVar3.x;
      auVar16._4_4_ = TVar3.y;
      auVar11 = vsubps_avx(auVar21._0_16_,auVar14);
      auVar9._0_4_ = auVar14._0_4_ * TVar3.x;
      auVar9._4_4_ = auVar14._4_4_ * TVar3.y;
      auVar9._8_4_ = auVar14._8_4_ * 0.0;
      auVar9._12_4_ = auVar14._12_4_ * 0.0;
      auVar11 = vfnmadd231ps_fma(auVar9,auVar16,auVar11);
      local_50 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar11);
      FVar10 = Evaluate(this,(Point2f *)&local_50);
      auVar21 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar11 = vpmovsxbq_avx(ZEXT216(0x1b2d));
      auVar20 = ZEXT1664(auVar11);
      auVar11 = vpmovsxbq_avx(ZEXT216(0x2d1b));
      auVar18 = ZEXT1664(auVar11);
      auVar19 = ZEXT1664(CONCAT412(0x3f7fffff,CONCAT48(0x3f7fffff,0x3f7fffff3f7fffff)));
      fVar12 = fVar12 + FVar10;
      iVar5 = iVar5 + 1;
      uVar7 = uVar6;
    } while (iVar5 != 0x40);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x40);
  fVar1 = fVar1 + fVar1;
  return (fVar1 + fVar1) * fVar2 * fVar12 * 0.00024414062;
}

Assistant:

Float LanczosSincFilter::Integral() const {
    Float sum = 0;
    int sqrtSamples = 64;
    int nSamples = sqrtSamples * sqrtSamples;
    Float area = 2 * radius.x * 2 * radius.y;
    RNG rng;
    for (int y = 0; y < sqrtSamples; ++y) {
        for (int x = 0; x < sqrtSamples; ++x) {
            Point2f u((x + rng.Uniform<Float>()) / sqrtSamples,
                      (y + rng.Uniform<Float>()) / sqrtSamples);
            Point2f p(Lerp(u.x, -radius.x, radius.x), Lerp(u.y, -radius.y, radius.y));
            sum += Evaluate(p);
        }
    }
    return sum / nSamples * area;
}